

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<QPdfEnginePrivate::AttachmentInfo*,long_long>
               (AttachmentInfo *first,longlong n,AttachmentInfo *d_first)

{
  AttachmentInfo *pAVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char *pcVar6;
  AttachmentInfo *pAVar7;
  AttachmentInfo *pAVar8;
  long in_FS_OFFSET;
  Destructor local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = d_first + n;
  pAVar8 = first;
  pAVar7 = pAVar1;
  if (first < pAVar1) {
    pAVar8 = pAVar1;
    pAVar7 = first;
  }
  local_30.intermediate = d_first;
  if (pAVar7 != d_first) {
    do {
      pDVar2 = (first->fileName).d.d;
      (first->fileName).d.d = (Data *)0x0;
      ((local_30.intermediate)->fileName).d.d = pDVar2;
      pcVar3 = (first->fileName).d.ptr;
      (first->fileName).d.ptr = (char16_t *)0x0;
      ((local_30.intermediate)->fileName).d.ptr = pcVar3;
      qVar4 = (first->fileName).d.size;
      (first->fileName).d.size = 0;
      ((local_30.intermediate)->fileName).d.size = qVar4;
      pDVar5 = (first->data).d.d;
      (first->data).d.d = (Data *)0x0;
      ((local_30.intermediate)->data).d.d = pDVar5;
      pcVar6 = (first->data).d.ptr;
      (first->data).d.ptr = (char *)0x0;
      ((local_30.intermediate)->data).d.ptr = pcVar6;
      qVar4 = (first->data).d.size;
      (first->data).d.size = 0;
      ((local_30.intermediate)->data).d.size = qVar4;
      pDVar2 = (first->mimeType).d.d;
      (first->mimeType).d.d = (Data *)0x0;
      ((local_30.intermediate)->mimeType).d.d = pDVar2;
      pcVar3 = (first->mimeType).d.ptr;
      (first->mimeType).d.ptr = (char16_t *)0x0;
      ((local_30.intermediate)->mimeType).d.ptr = pcVar3;
      qVar4 = (first->mimeType).d.size;
      (first->mimeType).d.size = 0;
      ((local_30.intermediate)->mimeType).d.size = qVar4;
      local_30.intermediate = local_30.intermediate + 1;
      first = first + 1;
    } while (local_30.intermediate != pAVar7);
  }
  local_30.iter = &local_30.end;
  for (pAVar7 = local_30.intermediate; local_30.end = d_first, pAVar7 != pAVar1; pAVar7 = pAVar7 + 1
      ) {
    pDVar2 = (pAVar7->fileName).d.d;
    (pAVar7->fileName).d.d = (first->fileName).d.d;
    (first->fileName).d.d = pDVar2;
    pcVar3 = (pAVar7->fileName).d.ptr;
    (pAVar7->fileName).d.ptr = (first->fileName).d.ptr;
    (first->fileName).d.ptr = pcVar3;
    qVar4 = (pAVar7->fileName).d.size;
    (pAVar7->fileName).d.size = (first->fileName).d.size;
    (first->fileName).d.size = qVar4;
    pDVar5 = (pAVar7->data).d.d;
    (pAVar7->data).d.d = (first->data).d.d;
    (first->data).d.d = pDVar5;
    pcVar6 = (pAVar7->data).d.ptr;
    (pAVar7->data).d.ptr = (first->data).d.ptr;
    (first->data).d.ptr = pcVar6;
    qVar4 = (pAVar7->data).d.size;
    (pAVar7->data).d.size = (first->data).d.size;
    (first->data).d.size = qVar4;
    pDVar2 = (pAVar7->mimeType).d.d;
    (pAVar7->mimeType).d.d = (first->mimeType).d.d;
    (first->mimeType).d.d = pDVar2;
    pcVar3 = (pAVar7->mimeType).d.ptr;
    (pAVar7->mimeType).d.ptr = (first->mimeType).d.ptr;
    (first->mimeType).d.ptr = pcVar3;
    qVar4 = (pAVar7->mimeType).d.size;
    (pAVar7->mimeType).d.size = (first->mimeType).d.size;
    (first->mimeType).d.size = qVar4;
    first = first + 1;
  }
  while (first != pAVar8) {
    pDVar2 = first[-1].mimeType.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].mimeType.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar5 = first[-1].data.d.d;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].data.d.d)->super_QArrayData,1,0x10);
      }
    }
    first = first + -1;
    pDVar2 = (first->fileName).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((first->fileName).d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<QPdfEnginePrivate::AttachmentInfo_*,_long_long>::Destructor::
  ~Destructor(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}